

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

void Gia_ObjComputeTruth6CisSupport_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vSupp)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  int iVar9;
  
  uVar7 = (ulong)(uint)iObj;
  while( true ) {
    iVar6 = (int)uVar7;
    if ((iVar6 < 0) || (p->nObjs <= iVar6)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (p->nTravIdsAlloc <= iVar6) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[uVar7] == p->nTravIds) {
      return;
    }
    pGVar8 = p->pObjs + uVar7;
    p->pTravIds[uVar7] = p->nTravIds;
    uVar3 = (uint)*(undefined8 *)pGVar8;
    if ((~uVar3 & 0x9fffffff) == 0) break;
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                    ,0x16a,"void Gia_ObjComputeTruth6CisSupport_rec(Gia_Man_t *, int, Vec_Int_t *)")
      ;
    }
    if (p->nObjs <= iVar6) {
LAB_00238aa5:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ObjComputeTruth6CisSupport_rec(p,iVar6 - (uVar3 & 0x1fffffff),vSupp);
    pGVar1 = p->pObjs;
    if ((pGVar8 < pGVar1) || (pGVar1 + p->nObjs <= pGVar8)) goto LAB_00238aa5;
    uVar7 = (ulong)((int)((ulong)((long)pGVar8 - (long)pGVar1) >> 2) * -0x55555555 -
                   (*(uint *)&pGVar8->field_0x4 & 0x1fffffff));
  }
  uVar3 = vSupp->nCap;
  if (vSupp->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vSupp->pArray == (int *)0x0) {
        piVar4 = (int *)malloc(0x40);
      }
      else {
        piVar4 = (int *)realloc(vSupp->pArray,0x40);
      }
      vSupp->pArray = piVar4;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar3 * 2;
      if (iVar9 <= (int)uVar3) goto LAB_00238a66;
      if (vSupp->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((ulong)uVar3 << 3);
      }
      else {
        piVar4 = (int *)realloc(vSupp->pArray,(ulong)uVar3 << 3);
      }
      vSupp->pArray = piVar4;
    }
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vSupp->nCap = iVar9;
  }
LAB_00238a66:
  lVar5 = (long)vSupp->nSize;
  vSupp->nSize = vSupp->nSize + 1;
  if (0 < lVar5) {
    piVar4 = vSupp->pArray;
    do {
      iVar9 = piVar4[lVar5 + -1];
      if (iVar9 <= iVar6) goto LAB_00238a93;
      piVar4[lVar5] = iVar9;
      bVar2 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar2);
    lVar5 = 0;
  }
LAB_00238a93:
  vSupp->pArray[(int)lVar5] = iVar6;
  return;
}

Assistant:

void Gia_ObjComputeTruth6CisSupport_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPushOrder( vSupp, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruth6CisSupport_rec( p, Gia_ObjFaninId0p(p, pObj), vSupp );
    Gia_ObjComputeTruth6CisSupport_rec( p, Gia_ObjFaninId1p(p, pObj), vSupp );
}